

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_update_polish(OSQPWorkspace *work,c_int polish_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_polish");
    return cVar1;
  }
  if (1 < (ulong)polish_new) {
    printf("ERROR in %s: ","osqp_update_polish");
    printf("polish should be either 0 or 1");
    putchar(10);
    return 1;
  }
  work->settings->polish = polish_new;
  work->info->polish_time = 0.0;
  return 0;
}

Assistant:

c_int osqp_update_polish(OSQPWorkspace *work, c_int polish_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that polish is either 0 or 1
  if ((polish_new != 0) && (polish_new != 1)) {
# ifdef PRINTING
    c_eprint("polish should be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  // Update polish
  work->settings->polish = polish_new;

# ifdef PROFILING

  // Reset polish time to zero
  work->info->polish_time = 0.0;
# endif /* ifdef PROFILING */

  return 0;
}